

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpegd_parser.c
# Opt level: O0

MPP_RET jpegd_init(void *ctx,ParserCfg *parser_cfg)

{
  MppDecHwCap *pMVar1;
  void *pvVar2;
  MppDecHwCap *hw_info;
  JpegdCtx *JpegCtx;
  ParserCfg *parser_cfg_local;
  void *ctx_local;
  
  pMVar1 = parser_cfg->hw_info;
  if ((jpegd_debug & 1) != 0) {
    _mpp_log_l(4,"jpegd_parser","enter\n","jpegd_init");
  }
  hw_info = (MppDecHwCap *)ctx;
  if ((ctx == (void *)0x0) &&
     (hw_info = (MppDecHwCap *)mpp_osal_calloc("jpegd_init",0x70), hw_info == (MppDecHwCap *)0x0)) {
    _mpp_log_l(2,"jpegd_parser","NULL pointer","jpegd_init");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    mpp_env_get_u32("jpegd_debug",&jpegd_debug,0);
    *(undefined4 *)&hw_info[6].field_0x4 = 0;
    if ((pMVar1 == (MppDecHwCap *)0x0) || ((*(ulong *)&pMVar1->field_0x4 >> 0x18 & 1) == 0)) {
      hw_info[6].cap_coding = 1;
    }
    else {
      hw_info[6].cap_coding = 0;
    }
    *(MppBufSlots *)&hw_info->field_0x8 = parser_cfg->frame_slots;
    *(MppBufSlots *)hw_info = parser_cfg->packet_slots;
    *(undefined4 *)&hw_info[1].field_0x4 = 0xffffffff;
    mpp_buf_slot_setup(*(MppBufSlots *)&hw_info->field_0x8,1);
    pvVar2 = mpp_osal_calloc("jpegd_init",0x80000);
    *(void **)(hw_info + 2) = pvVar2;
    if (*(long *)(hw_info + 2) == 0) {
      _mpp_log_l(2,"jpegd_parser","no memory!","jpegd_init");
      ctx_local._4_4_ = MPP_ERR_NOMEM;
    }
    else {
      hw_info[3].cap_coding = 0x80000;
      if (hw_info[6].cap_coding == 0) {
        *(undefined8 *)&hw_info[3].field_0x4 = 0;
      }
      else {
        mpp_packet_init((MppPacket *)&hw_info[3].field_0x4,*(void **)(hw_info + 2),0x80000);
      }
      mpp_frame_init((MppFrame *)(hw_info + 4));
      if (*(long *)(hw_info + 4) == 0) {
        _mpp_log_l(2,"jpegd_parser","Failed to allocate output frame buffer","jpegd_init");
        ctx_local._4_4_ = MPP_ERR_NOMEM;
      }
      else {
        pvVar2 = mpp_osal_calloc("jpegd_init",0x58);
        *(void **)(hw_info + 8) = pvVar2;
        if (*(long *)(hw_info + 8) == 0) {
          _mpp_log_l(2,"jpegd_parser","allocate bit_ctx failed\n","jpegd_init");
          ctx_local._4_4_ = MPP_ERR_MALLOC;
        }
        else {
          pvVar2 = mpp_osal_calloc("jpegd_init",0x930);
          *(void **)&hw_info[8].field_0x8 = pvVar2;
          if (*(long *)&hw_info[8].field_0x8 == 0) {
            _mpp_log_l(2,"jpegd_parser","allocate syntax failed\n","jpegd_init");
            ctx_local._4_4_ = MPP_ERR_MALLOC;
          }
          else {
            memset(*(void **)&hw_info[8].field_0x8,0,0x930);
            *(undefined8 *)&hw_info[4].field_0x8 = 0;
            *(undefined4 *)&hw_info[5].field_0x4 = 0;
            *(undefined4 *)&hw_info[5].field_0x8 = 0;
            if ((jpegd_debug & 1) != 0) {
              _mpp_log_l(4,"jpegd_parser","exit\n","jpegd_init");
            }
            ctx_local._4_4_ = MPP_OK;
          }
        }
      }
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET jpegd_init(void *ctx, ParserCfg *parser_cfg)
{
    JpegdCtx *JpegCtx = (JpegdCtx *)ctx;
    const MppDecHwCap *hw_info = parser_cfg->hw_info;

    jpegd_dbg_func("enter\n");

    if (NULL == JpegCtx) {
        JpegCtx = (JpegdCtx *)mpp_calloc(JpegdCtx, 1);
        if (NULL == JpegCtx) {
            mpp_err_f("NULL pointer");
            return MPP_ERR_NULL_PTR;
        }
    }

    mpp_env_get_u32("jpegd_debug", &jpegd_debug, 0);
    // mpp only support baseline
    JpegCtx->scan_all_marker = 0;

    if (hw_info && hw_info->cap_hw_jpg_fix) {
        /*
         * no need to copy stream when decoding jpeg;
         * just scan parts of markers to reduce CPU's occupancy
         */
        JpegCtx->copy_flag = 0;
    } else {
        // TODO: do not copy if input provides valid fd and virtual ptr
        JpegCtx->copy_flag = 1;
    }

    JpegCtx->frame_slots = parser_cfg->frame_slots;
    JpegCtx->packet_slots = parser_cfg->packet_slots;
    JpegCtx->frame_slot_index = -1;
    mpp_buf_slot_setup(JpegCtx->frame_slots, 1);

    JpegCtx->recv_buffer = mpp_calloc(RK_U8, JPEGD_STREAM_BUFF_SIZE);
    if (NULL == JpegCtx->recv_buffer) {
        mpp_err_f("no memory!");
        return MPP_ERR_NOMEM;
    }
    JpegCtx->bufferSize = JPEGD_STREAM_BUFF_SIZE;
    if (JpegCtx->copy_flag) {
        mpp_packet_init(&JpegCtx->input_packet,
                        JpegCtx->recv_buffer, JPEGD_STREAM_BUFF_SIZE);
    } else {
        JpegCtx->input_packet = NULL;
    }

    mpp_frame_init(&JpegCtx->output_frame);
    if (!JpegCtx->output_frame) {
        mpp_err_f("Failed to allocate output frame buffer");
        return MPP_ERR_NOMEM;
    }

    JpegCtx->bit_ctx = mpp_calloc(BitReadCtx_t, 1);
    if (JpegCtx->bit_ctx == NULL) {
        mpp_err_f("allocate bit_ctx failed\n");
        return MPP_ERR_MALLOC;
    }

    JpegCtx->syntax = mpp_calloc(JpegdSyntax, 1);
    if (JpegCtx->syntax == NULL) {
        mpp_err_f("allocate syntax failed\n");
        return MPP_ERR_MALLOC;
    }
    memset(JpegCtx->syntax, 0, sizeof(JpegdSyntax));

    JpegCtx->pts = 0;
    JpegCtx->eos = 0;
    JpegCtx->input_jpeg_count = 0;

    jpegd_dbg_func("exit\n");
    return MPP_OK;
}